

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileRemote.cpp
# Opt level: O0

void __thiscall
adios2::transport::FileRemote::Write(FileRemote *this,char *buffer,size_t size,size_t start)

{
  string local_c8 [39];
  allocator local_a1;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  string *in_stack_ffffffffffffff70;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string local_78 [55];
  allocator local_41;
  string local_40 [64];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Toolkit",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_78,"transport::file::FileRemote",(allocator *)&stack0xffffffffffffff87);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff60,"Write",&local_a1);
  std::operator+((char *)in_stack_ffffffffffffff68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  helper::Throw<std::ios_base::failure[abi:cxx11]>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
  std::__cxx11::string::~string(local_c8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff87);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  return;
}

Assistant:

void FileRemote::Write(const char *buffer, size_t size, size_t start)
{
    helper::Throw<std::ios_base::failure>("Toolkit", "transport::file::FileRemote", "Write",
                                          "does not support writing yet " + m_Name);
}